

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

bool wallet::HasErrorMsg(Result<wallet::SelectionResult> *res)

{
  long in_FS_OFFSET;
  bilingual_str bStack_58;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  util::ErrorString<wallet::SelectionResult>(&bStack_58,res);
  bilingual_str::~bilingual_str(&bStack_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bStack_58.original._M_string_length != 0;
  }
  __stack_chk_fail();
}

Assistant:

static bool HasErrorMsg(const util::Result<SelectionResult>& res) { return !util::ErrorString(res).empty(); }